

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

Area * __thiscall SceneParser::parseArea(SceneParser *this)

{
  int iVar1;
  Area *this_00;
  undefined1 local_9c [8];
  Vector3f sideTwo;
  Vector3f sideOne;
  Vector3f corner;
  char token [100];
  SceneParser *this_local;
  
  getToken(this,(char *)(corner.m_elements + 1));
  iVar1 = strcmp((char *)(corner.m_elements + 1),"{");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x177,"Area *SceneParser::parseArea()");
  }
  getToken(this,(char *)(corner.m_elements + 1));
  iVar1 = strcmp((char *)(corner.m_elements + 1),"corner");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"corner\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x179,"Area *SceneParser::parseArea()");
  }
  readVector3f((SceneParser *)(sideOne.m_elements + 1));
  getToken(this,(char *)(corner.m_elements + 1));
  iVar1 = strcmp((char *)(corner.m_elements + 1),"sideOne");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"sideOne\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x17c,"Area *SceneParser::parseArea()");
  }
  readVector3f((SceneParser *)(sideTwo.m_elements + 1));
  getToken(this,(char *)(corner.m_elements + 1));
  iVar1 = strcmp((char *)(corner.m_elements + 1),"sideTwo");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"sideTwo\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x17f,"Area *SceneParser::parseArea()");
  }
  readVector3f((SceneParser *)local_9c);
  getToken(this,(char *)(corner.m_elements + 1));
  iVar1 = strcmp((char *)(corner.m_elements + 1),"}");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x182,"Area *SceneParser::parseArea()");
  }
  if (this->_current_material != (Material *)0x0) {
    this_00 = (Area *)operator_new(0x60);
    Area::Area(this_00,(Vector3f *)(sideOne.m_elements + 1),(Vector3f *)(sideTwo.m_elements + 1),
               (Vector3f *)local_9c,this->_current_material);
    return this_00;
  }
  __assert_fail("_current_material != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x183,"Area *SceneParser::parseArea()");
}

Assistant:

Area *
SceneParser::parseArea() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "corner"));
    Vector3f corner = readVector3f();
    getToken(token);
    assert(!strcmp(token, "sideOne"));
    Vector3f sideOne = readVector3f();
    getToken(token);
    assert(!strcmp(token, "sideTwo"));
    Vector3f sideTwo = readVector3f();
    getToken(token);
    assert(!strcmp(token, "}"));
    assert(_current_material != NULL);
    return new Area(corner, sideOne, sideTwo, _current_material);
}